

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
            );
  internal::InitProtobufDefaults();
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&_FileDescriptorSet_default_instance_);
  DAT_00726670 = 1;
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)&_FileDescriptorProto_default_instance_);
  DAT_00726750 = 1;
  DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
            ((DescriptorProto_ExtensionRange *)&_DescriptorProto_ExtensionRange_default_instance_);
  DAT_00726778 = 1;
  DescriptorProto_ReservedRange::DescriptorProto_ReservedRange
            ((DescriptorProto_ReservedRange *)&_DescriptorProto_ReservedRange_default_instance_);
  DAT_007267a0 = 1;
  DescriptorProto::DescriptorProto((DescriptorProto *)&_DescriptorProto_default_instance_);
  DAT_00726890 = 1;
  FieldDescriptorProto::FieldDescriptorProto
            ((FieldDescriptorProto *)&_FieldDescriptorProto_default_instance_);
  DAT_007268f0 = 1;
  OneofDescriptorProto::OneofDescriptorProto
            ((OneofDescriptorProto *)&_OneofDescriptorProto_default_instance_);
  DAT_00726920 = 1;
  EnumDescriptorProto::EnumDescriptorProto
            ((EnumDescriptorProto *)&_EnumDescriptorProto_default_instance_);
  DAT_00726968 = 1;
  EnumValueDescriptorProto::EnumValueDescriptorProto
            ((EnumValueDescriptorProto *)&_EnumValueDescriptorProto_default_instance_);
  DAT_007269a0 = 1;
  ServiceDescriptorProto::ServiceDescriptorProto
            ((ServiceDescriptorProto *)&_ServiceDescriptorProto_default_instance_);
  DAT_007269e8 = 1;
  MethodDescriptorProto::MethodDescriptorProto
            ((MethodDescriptorProto *)&_MethodDescriptorProto_default_instance_);
  DAT_00726a30 = 1;
  FileOptions::FileOptions((FileOptions *)&_FileOptions_default_instance_);
  DAT_00726ae8 = 1;
  MessageOptions::MessageOptions((MessageOptions *)&_MessageOptions_default_instance_);
  DAT_00726b60 = 1;
  FieldOptions::FieldOptions((FieldOptions *)&_FieldOptions_default_instance_);
  DAT_00726be0 = 1;
  OneofOptions::OneofOptions((OneofOptions *)&_OneofOptions_default_instance_);
  DAT_00726c50 = 1;
  EnumOptions::EnumOptions((EnumOptions *)&_EnumOptions_default_instance_);
  DAT_00726cc8 = 1;
  EnumValueOptions::EnumValueOptions((EnumValueOptions *)&_EnumValueOptions_default_instance_);
  DAT_00726d40 = 1;
  ServiceOptions::ServiceOptions((ServiceOptions *)&_ServiceOptions_default_instance_);
  DAT_00726db8 = 1;
  MethodOptions::MethodOptions((MethodOptions *)&_MethodOptions_default_instance_);
  DAT_00726e30 = 1;
  UninterpretedOption_NamePart::UninterpretedOption_NamePart
            ((UninterpretedOption_NamePart *)&_UninterpretedOption_NamePart_default_instance_);
  DAT_00726e60 = 1;
  UninterpretedOption::UninterpretedOption
            ((UninterpretedOption *)&_UninterpretedOption_default_instance_);
  DAT_00726ec8 = 1;
  SourceCodeInfo_Location::SourceCodeInfo_Location
            ((SourceCodeInfo_Location *)&_SourceCodeInfo_Location_default_instance_);
  DAT_00726f40 = 1;
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&_SourceCodeInfo_default_instance_);
  DAT_00726f78 = 1;
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)&_GeneratedCodeInfo_Annotation_default_instance_);
  DAT_00726fc0 = 1;
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&_GeneratedCodeInfo_default_instance_);
  DAT_00726740 = &_FileOptions_default_instance_;
  DAT_00726748 = &_SourceCodeInfo_default_instance_;
  DAT_00726888 = &_MessageOptions_default_instance_;
  DAT_007268d8 = &_FieldOptions_default_instance_;
  DAT_00726918 = &_OneofOptions_default_instance_;
  DAT_00726960 = &_EnumOptions_default_instance_;
  DAT_00726990 = &_EnumValueOptions_default_instance_;
  DAT_007269e0 = &_ServiceOptions_default_instance_;
  DAT_00726a20 = &_MethodOptions_default_instance_;
  DAT_00726ff8 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _FileDescriptorSet_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.DefaultConstruct();
  _DescriptorProto_ExtensionRange_default_instance_.DefaultConstruct();
  _DescriptorProto_ReservedRange_default_instance_.DefaultConstruct();
  _DescriptorProto_default_instance_.DefaultConstruct();
  _FieldDescriptorProto_default_instance_.DefaultConstruct();
  _OneofDescriptorProto_default_instance_.DefaultConstruct();
  _EnumDescriptorProto_default_instance_.DefaultConstruct();
  _EnumValueDescriptorProto_default_instance_.DefaultConstruct();
  _ServiceDescriptorProto_default_instance_.DefaultConstruct();
  _MethodDescriptorProto_default_instance_.DefaultConstruct();
  _FileOptions_default_instance_.DefaultConstruct();
  _MessageOptions_default_instance_.DefaultConstruct();
  _FieldOptions_default_instance_.DefaultConstruct();
  _OneofOptions_default_instance_.DefaultConstruct();
  _EnumOptions_default_instance_.DefaultConstruct();
  _EnumValueOptions_default_instance_.DefaultConstruct();
  _ServiceOptions_default_instance_.DefaultConstruct();
  _MethodOptions_default_instance_.DefaultConstruct();
  _UninterpretedOption_NamePart_default_instance_.DefaultConstruct();
  _UninterpretedOption_default_instance_.DefaultConstruct();
  _SourceCodeInfo_Location_default_instance_.DefaultConstruct();
  _SourceCodeInfo_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_Annotation_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FileOptions*>(
      ::google::protobuf::FileOptions::internal_default_instance());
  _FileDescriptorProto_default_instance_.get_mutable()->source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(
      ::google::protobuf::SourceCodeInfo::internal_default_instance());
  _DescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MessageOptions*>(
      ::google::protobuf::MessageOptions::internal_default_instance());
  _FieldDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FieldOptions*>(
      ::google::protobuf::FieldOptions::internal_default_instance());
  _OneofDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::OneofOptions*>(
      ::google::protobuf::OneofOptions::internal_default_instance());
  _EnumDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumOptions*>(
      ::google::protobuf::EnumOptions::internal_default_instance());
  _EnumValueDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumValueOptions*>(
      ::google::protobuf::EnumValueOptions::internal_default_instance());
  _ServiceDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::ServiceOptions*>(
      ::google::protobuf::ServiceOptions::internal_default_instance());
  _MethodDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MethodOptions*>(
      ::google::protobuf::MethodOptions::internal_default_instance());
}